

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O3

int __thiscall FullSearch::search(FullSearch *this,Board *board)

{
  Position pos;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  pointer pPVar6;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  vector<Position,_std::allocator<Position>_> local_a0;
  Board local_88;
  
  if (board->gameEnd == true) {
    Board::countBoard(board);
    if (local_88.direction[0].col == local_88.direction[0].row) {
      return 0;
    }
    if (board->nowPlayer == 0) {
      bVar1 = local_88.direction[0].row < local_88.direction[0].col;
    }
    else {
      if (board->nowPlayer != 1) goto LAB_0010520c;
      bVar1 = local_88.direction[0].col < local_88.direction[0].row;
    }
    iVar5 = (uint)bVar1 * 2 + -1;
  }
  else {
LAB_0010520c:
    Board::findPossibleChoose(&local_a0,board);
    if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar4 = 1;
    }
    else {
      pPVar6 = local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = 0;
      do {
        pos = *pPVar6;
        Board::Board(&local_88,board);
        Board::doChoose(&local_88,pos);
        iVar5 = search(this,&local_88);
        bVar3 = bVar2;
        if (local_88.nowPlayer == board->nowPlayer) {
          bVar3 = 1;
          if ((iVar5 != 0) && (bVar3 = bVar2, iVar5 == 1)) {
LAB_001052bb:
            iVar5 = 1;
            goto LAB_001052a2;
          }
        }
        else if (iVar5 == 0) {
          bVar3 = 1;
        }
        else if ((iVar5 != 1) && (iVar5 == -1)) goto LAB_001052bb;
        pPVar6 = pPVar6 + 1;
        bVar2 = bVar3;
      } while (pPVar6 != local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      uVar4 = (uint)(~bVar3 & 1);
    }
    iVar5 = -uVar4;
LAB_001052a2:
    if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start != (Position *)0x0) {
      operator_delete(local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  return iVar5;
}

Assistant:

int FullSearch::search(Board &board) {
    if (board.gameEnd) {
        int whiteNum,blackNum;
        tie(ignore, whiteNum, blackNum) = board.countBoard();
        if (whiteNum == blackNum) {
            return TIE;
        }
        if (board.nowPlayer == Board::BLACK) {
            return blackNum > whiteNum ? WIN : LOST;
        }
        if (board.nowPlayer == Board::WHITE) {
            return blackNum < whiteNum ? WIN : LOST;
        }
    }
    bool isAbleToTie = false;
    bool isAbleToWin = false;

    vector<Position> possibleChoose = board.findPossibleChoose();
    for (Position choose : possibleChoose) {
        Board tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        //这里胜负正好相反，下一手赢了，说明当前手输了。
        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        // if(board.nowPlayer == Board::WHITE){
        //     printf("%d\n", value);
        // }

        if (value == WIN) {
            isAbleToWin = true;
            //已经找到赢的路了，剪枝
            break;
        } else if (value == TIE) {
            isAbleToTie = true;
        }
    }
    if (isAbleToWin) {
        return WIN;
    } else if (isAbleToTie) {
        return TIE;
    } else {
        return LOST;
    }
}